

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O1

bool jsoncons::
     json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::valarray<unsigned_long>,_void>
     ::is(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  bool bVar1;
  type_conflict9 tVar2;
  iterator other;
  const_array_range_type cVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> e;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_40;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(j);
  if (bVar1) {
    cVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(j);
    other = cVar3.first_._M_current;
    if (other._M_current != cVar3.last_._M_current._M_current) {
      do {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                  (&local_40,other._M_current);
        tVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                is_integer<unsigned_long>(&local_40);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_40);
        if (!tVar2) {
          bVar1 = false;
        }
        other._M_current = other._M_current + 1;
      } while (tVar2 && other._M_current != cVar3.last_._M_current._M_current);
    }
  }
  return bVar1;
}

Assistant:

static bool is(const Json& j) noexcept
        {
            bool result = j.is_array();
            if (result)
            {
                for (auto e : j.array_range())
                {
                    if (!e.template is<T>())
                    {
                        result = false;
                        break;
                    }
                }
            }
            return result;
        }